

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O2

int32_t icu_63::DayPeriodRulesDataSink::parseSetNum(char *setNumStr,UErrorCode *errorCode)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((*setNumStr == 's') && (setNumStr[1] == 'e')) && (setNumStr[2] == 't')) {
      iVar2 = 0;
      for (pbVar3 = (byte *)(setNumStr + 3); bVar1 = *pbVar3, bVar1 != 0; pbVar3 = pbVar3 + 1) {
        if (9 < (byte)(bVar1 - 0x30)) goto LAB_002be76f;
        iVar2 = iVar2 * 10 + (uint)bVar1 + -0x30;
      }
      if (iVar2 != 0) {
        return iVar2;
      }
    }
LAB_002be76f:
    *errorCode = U_INVALID_FORMAT_ERROR;
  }
  return -1;
}

Assistant:

static int32_t parseSetNum(const char *setNumStr, UErrorCode &errorCode) {
        if (U_FAILURE(errorCode)) { return -1; }

        if (uprv_strncmp(setNumStr, "set", 3) != 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        }

        int32_t i = 3;
        int32_t setNum = 0;
        while (setNumStr[i] != 0) {
            int32_t digit = setNumStr[i] - '0';
            if (digit < 0 || 9 < digit) {
                errorCode = U_INVALID_FORMAT_ERROR;
                return -1;
            }
            setNum = 10 * setNum + digit;
            ++i;
        }

        // Rule set number must not be zero. (0 is used to indicate "not found" by hashmap.)
        // Currently ICU data conveniently starts numbering rule sets from 1.
        if (setNum == 0) {
            errorCode = U_INVALID_FORMAT_ERROR;
            return -1;
        } else {
            return setNum;
        }
    }